

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeSPRRegListOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = Val & 0xff;
  uVar4 = Val >> 8 & 0x1f;
  DVar1 = MCDisassembler_Success;
  if (0x20 < uVar4 + uVar3 || uVar3 == 0) {
    if (0x20 < uVar4 + uVar3) {
      uVar3 = 0x20 - uVar4;
    }
    uVar3 = uVar3 + (uVar3 == 0);
    DVar1 = MCDisassembler_SoftFail;
  }
  MCOperand_CreateReg0(Inst,(uint)SPRDecoderTable[uVar4]);
  if (uVar3 != 1) {
    lVar2 = 0;
    if (uVar4 + 1 < 0x20) {
      MCOperand_CreateReg0(Inst,(uint)SPRDecoderTable[uVar4 + 1]);
      lVar2 = 3;
    }
    DVar1 = (*(code *)((long)&DAT_0032c480 + (long)(int)(&DAT_0032c480)[lVar2]))();
    return DVar1;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeSPRRegListOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned i;
	unsigned Vd = fieldFromInstruction_4(Val, 8, 5);
	unsigned regs = fieldFromInstruction_4(Val, 0, 8);

	// In case of unpredictable encoding, tweak the operands.
	if (regs == 0 || (Vd + regs) > 32) {
		regs = Vd + regs > 32 ? 32 - Vd : regs;
		regs = (1u > regs? 1u : regs);
		S = MCDisassembler_SoftFail;
	}

	if (!Check(&S, DecodeSPRRegisterClass(Inst, Vd, Address, Decoder)))
		return MCDisassembler_Fail;
	for (i = 0; i < (regs - 1); ++i) {
		if (!Check(&S, DecodeSPRRegisterClass(Inst, ++Vd, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}